

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlSetNs(xmlNodePtr node,xmlNsPtr ns)

{
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  
  if ((node != (xmlNodePtr)0x0) &&
     ((node->type == XML_ELEMENT_NODE || (node->type == XML_ATTRIBUTE_NODE)))) {
    node->ns = ns;
  }
  return;
}

Assistant:

void
xmlSetNs(xmlNodePtr node, xmlNsPtr ns) {
    if (node == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlSetNs: node == NULL\n");
#endif
	return;
    }
    if ((node->type == XML_ELEMENT_NODE) ||
        (node->type == XML_ATTRIBUTE_NODE))
	node->ns = ns;
}